

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Time.cpp
# Opt level: O0

void __thiscall
axl::sys::Time::setTimestampImpl(Time *this,uint64_t timestamp,bool isLocal,int timeZone)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int in_ECX;
  byte in_DL;
  ulong in_RSI;
  short *in_RDI;
  time64_t posixTime;
  tm tmStruct;
  long local_58;
  tm local_50;
  byte local_11;
  ulong local_10;
  
  local_11 = in_DL & 1;
  local_58 = in_RSI / 10000000 - 0x2b6109100;
  local_10 = in_RSI;
  if (local_11 == 0) {
    iVar4 = getTimeZoneOffsetInMinutes(in_ECX);
    local_58 = iVar4 * 0x3c + local_58;
    gmtime_r(&local_58,&local_50);
  }
  else {
    localtime_r(&local_58,&local_50);
  }
  *in_RDI = (short)local_50.tm_year + 0x76c;
  in_RDI[1] = (short)local_50.tm_mon;
  in_RDI[2] = (short)local_50.tm_mday;
  in_RDI[3] = (short)local_50.tm_wday;
  in_RDI[4] = (short)local_50.tm_hour;
  in_RDI[5] = (short)local_50.tm_min;
  in_RDI[6] = (short)local_50.tm_sec;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_10 / 10000;
  in_RDI[7] = SUB162(auVar1 % ZEXT816(1000),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_10 / 10;
  in_RDI[8] = SUB162(auVar2 % ZEXT816(1000),0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_10;
  in_RDI[9] = SUB162(auVar3 % ZEXT816(10),0) * 100;
  return;
}

Assistant:

void
Time::setTimestampImpl(
	uint64_t timestamp,
	bool isLocal,
	int timeZone
) {
#if (_AXL_OS_WIN)
	SYSTEMTIME sysTime = { 0 };

	if (isLocal)
		::FileTimeToLocalFileTime((const FILETIME*)&timestamp, (FILETIME*)&timestamp);
	else
		timestamp += (int64_t)getTimeZoneOffsetInMinutes(timeZone) * 60 * 10000000;

	::FileTimeToSystemTime((const FILETIME*)&timestamp, &sysTime);

	m_year        = sysTime.wYear;
	m_month       = sysTime.wMonth - 1;
	m_monthDay    = sysTime.wDay;
	m_dayOfWeek   = sysTime.wDayOfWeek;
	m_hour        = sysTime.wHour;
	m_minute      = sysTime.wMinute;
	m_second      = sysTime.wSecond;

#else
	struct tm tmStruct;

	time64_t posixTime = timestamp / 10000000 - AXL_SYS_EPOCH_DIFF;

	if (isLocal) {
		localtime64_r(&posixTime, &tmStruct);
	} else {
		posixTime += getTimeZoneOffsetInMinutes(timeZone) * 60;
		gmtime64_r(&posixTime, &tmStruct);
	}

	m_year        = tmStruct.tm_year + 1900;
	m_month       = tmStruct.tm_mon;
	m_monthDay    = tmStruct.tm_mday;
	m_dayOfWeek   = tmStruct.tm_wday;
	m_hour        = tmStruct.tm_hour;
	m_minute      = tmStruct.tm_min;
	m_second      = tmStruct.tm_sec;
#endif

	m_milliSecond = (timestamp / 10000) % 1000;
	m_microSecond = (timestamp / 10) % 1000;
	m_nanoSecond  = (timestamp % 10) * 100;
}